

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_interpolation_with_magic_number.cc
# Opt level: O0

bool __thiscall
sptk::InputSourceInterpolationWithMagicNumber::Get
          (InputSourceInterpolationWithMagicNumber *this,
          vector<double,_std::allocator<double>_> *buffer)

{
  size_type sVar1;
  ulong uVar2;
  reference pvVar3;
  iterator __first;
  iterator __last;
  iterator __result;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  int i;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff48;
  value_type vVar4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff68;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff70;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar5;
  bool local_1;
  
  if ((in_RSI == (vector<double,_std::allocator<double>_> *)0x0) ||
     ((*(byte *)(in_RDI + 0x38) & 1) == 0)) {
    local_1 = false;
  }
  else if (*(int *)(in_RDI + 0x20) < 1) {
    local_1 = false;
  }
  else {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    if (sVar1 != (long)*(int *)(in_RDI + 0x24)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff70._M_current,
                 (size_type)in_stack_ffffffffffffff68._M_current);
    }
    std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
    std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff48);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
    std::
    copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + -1;
    if (*(int *)(in_RDI + 0x20) < 1) {
      if ((*(byte *)(in_RDI + 0x14) & 1) != 0) {
        *(undefined4 *)(in_RDI + 0x20) = 1;
      }
      local_1 = true;
    }
    else {
      *(int *)(in_RDI + 0x28) = *(int *)(in_RDI + 0x28) + 1;
      if (*(int *)(in_RDI + 0x28) % *(int *)(in_RDI + 8) == 0) {
        std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
        std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff48);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
        std::
        copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                  (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        uVar2 = (**(code **)(**(long **)(in_RDI + 0x30) + 0x20))
                          (*(long **)(in_RDI + 0x30),in_RDI + 0x58);
        if ((uVar2 & 1) == 0) {
          std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
          std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff48);
          std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
          std::
          copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          *(undefined4 *)(in_RDI + 0x20) = 1;
        }
        else {
          *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 8) + 1;
        }
        if (0 < *(int *)(in_RDI + 0xc)) {
          CalculateIncrement((InputSourceInterpolationWithMagicNumber *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        }
        *(undefined4 *)(in_RDI + 0x28) = 0;
      }
      else if ((*(int *)(in_RDI + 0xc) < 1) ||
              ((*(int *)(in_RDI + 0x28) + *(int *)(in_RDI + 0x10)) % *(int *)(in_RDI + 0xc) != 0)) {
        if ((*(int *)(in_RDI + 0xc) == 0) && (*(int *)(in_RDI + 8) / 2 == *(int *)(in_RDI + 0x28)))
        {
          __first = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
          __last = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff48);
          __result = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
          std::
          copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     __first._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     __last._M_current,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     __result._M_current);
        }
      }
      else {
        for (iVar5 = 0; iVar5 < *(int *)(in_RDI + 0x24); iVar5 = iVar5 + 1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),(long)iVar5
                             );
          if ((*pvVar3 != 1.79769313486232e+308) || (NAN(*pvVar3))) {
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                                (long)iVar5);
            vVar4 = *pvVar3;
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),
                                (long)iVar5);
            *pvVar3 = vVar4 + *pvVar3;
          }
          else {
            vVar4 = *(value_type *)(in_RDI + 0x18);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),
                                (long)iVar5);
            *pvVar3 = vVar4;
          }
        }
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool InputSourceInterpolationWithMagicNumber::Get(std::vector<double>* buffer) {
  if (NULL == buffer || !is_valid_) {
    return false;
  }

  if (remained_num_samples_ <= 0) {
    return false;
  }

  if (buffer->size() != static_cast<std::size_t>(data_length_)) {
    buffer->resize(data_length_);
  }

  std::copy(curr_data_.begin(), curr_data_.end(), buffer->begin());

  --remained_num_samples_;

  if (remained_num_samples_ <= 0) {
    if (use_final_frame_for_exceeded_frame_) {
      remained_num_samples_ = 1;
    }
    return true;
  }

  // Update internal states for the next call.
  ++point_index_in_frame_;

  if (0 == point_index_in_frame_ % frame_period_) {
    // Update current and next data.
    std::copy(next_data_.begin(), next_data_.end(), curr_data_.begin());
    if (!source_->Get(&next_data_)) {
      // Use the final data until the end of input sequence.
      std::copy(curr_data_.begin(), curr_data_.end(), next_data_.begin());
      remained_num_samples_ = 1;
    } else {
      remained_num_samples_ = frame_period_ + 1;
    }

    if (0 < interpolation_period_) {
      CalculateIncrement();
    }

    // Rewind point index.
    point_index_in_frame_ = 0;
  } else if (0 < interpolation_period_ &&
             0 == ((point_index_in_frame_ + first_interpolation_period_) %
                   interpolation_period_)) {
    // Interpolate adjacent data without magic number.
    for (int i(0); i < data_length_; ++i) {
      if (kCannotCalculateIncrements == increment_[i]) {
        curr_data_[i] = magic_number_;
      } else {
        curr_data_[i] += increment_[i];
      }
    }
  } else if (0 == interpolation_period_ &&
             frame_period_ / 2 == point_index_in_frame_) {
    std::copy(next_data_.begin(), next_data_.end(), curr_data_.begin());
  }

  return true;
}